

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_goto(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  ROOM_INDEX_DATA *room;
  CHAR_DATA *pCVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  if (*argument == '\0') {
    pcVar4 = "Goto where?\n\r";
  }
  else {
    room = find_location(ch,argument);
    if (room == (ROOM_INDEX_DATA *)0x0) {
      pcVar4 = "No such location.\n\r";
    }
    else {
      pCVar2 = room->people;
      if (pCVar2 == (CHAR_DATA *)0x0) {
        bVar6 = false;
      }
      else {
        iVar3 = 1;
        do {
          pCVar2 = pCVar2->next_in_room;
          iVar3 = iVar3 + -1;
        } while (pCVar2 != (CHAR_DATA *)0x0);
        bVar6 = iVar3 != 0;
      }
      bVar1 = is_room_owner(ch,room);
      if ((((bVar1) || (bVar1 = room_is_private(room), !bVar1)) || ((!bVar6 && (0x3b < ch->level))))
         && (((room->room_flags[0] & 0x4000) == 0 || (iVar3 = get_trust(ch), 0x3b < iVar3)))) {
        if (ch->fighting != (CHAR_DATA *)0x0) {
          stop_fighting(ch,true);
        }
        pCVar2 = ch->in_room->people;
        if (pCVar2 != (CHAR_DATA *)0x0) {
          do {
            iVar3 = get_trust(pCVar2);
            if ((ch->invis_level <= iVar3) &&
               (((iVar3 = get_trust(pCVar2), iVar3 != 0x33 || (ch->invis_level != 0x33)) ||
                (bVar6 = is_heroimm(pCVar2), bVar6)))) {
              if (((ch->pcdata == (PC_DATA *)0x0) || (*ch->pcdata->bamfout == '\0')) ||
                 (bVar6 = is_switched(ch), bVar6)) {
                pcVar4 = (char *)0x0;
                pcVar5 = "$n leaves in a swirling mist.";
              }
              else {
                pcVar4 = ch->pcdata->bamfout;
                pcVar5 = "$t";
              }
              act(pcVar5,ch,pcVar4,pCVar2,2);
            }
            pCVar2 = pCVar2->next_in_room;
          } while (pCVar2 != (CHAR_DATA *)0x0);
        }
        char_from_room(ch);
        char_to_room(ch,room);
        pCVar2 = ch->in_room->people;
        if (pCVar2 != (CHAR_DATA *)0x0) {
          do {
            iVar3 = get_trust(pCVar2);
            if ((ch->invis_level <= iVar3) &&
               (((iVar3 = get_trust(pCVar2), iVar3 != 0x33 || (ch->invis_level != 0x33)) ||
                (bVar6 = is_heroimm(pCVar2), bVar6)))) {
              if (((ch->pcdata == (PC_DATA *)0x0) || (*ch->pcdata->bamfin == '\0')) ||
                 (bVar6 = is_switched(ch), bVar6)) {
                pcVar4 = (char *)0x0;
                pcVar5 = "$n appears in a swirling mist.";
              }
              else {
                pcVar4 = ch->pcdata->bamfin;
                pcVar5 = "$t";
              }
              act(pcVar5,ch,pcVar4,pCVar2,2);
            }
            pCVar2 = pCVar2->next_in_room;
          } while (pCVar2 != (CHAR_DATA *)0x0);
        }
        do_look(ch,"auto");
        return;
      }
      pcVar4 = "Access denied.\n\r";
    }
  }
  send_to_char(pcVar4,ch);
  return;
}

Assistant:

void do_goto(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *location;
	CHAR_DATA *rch;
	int count = 0;

	if (argument[0] == '\0')
	{
		send_to_char("Goto where?\n\r", ch);
		return;
	}

	location = find_location(ch, argument);

	if (location == nullptr)
	{
		send_to_char("No such location.\n\r", ch);
		return;
	}

	count = 0;

	for (rch = location->people; rch != nullptr; rch = rch->next_in_room)
	{
		count++;
	}

	if (!is_room_owner(ch, location) && room_is_private(location) && (count > 1 || ch->level < MAX_LEVEL))
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (IS_SET(location->room_flags, ROOM_IMP_ONLY) && get_trust(ch) < 60)
	{
		send_to_char("Access denied.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
		stop_fighting(ch, true);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfout[0] != '\0' && !is_switched(ch))
				act("$t", ch, ch->pcdata->bamfout, rch, TO_VICT);
			else
				act("$n leaves in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	char_from_room(ch);
	char_to_room(ch, location);

	for (rch = ch->in_room->people; rch != nullptr; rch = rch->next_in_room)
	{
		if (get_trust(rch) >= ch->invis_level)
		{
			if (get_trust(rch) == LEVEL_HERO && ch->invis_level == LEVEL_HERO && !is_heroimm(rch))
				continue;

			if (ch->pcdata != nullptr && ch->pcdata->bamfin[0] != '\0' && !is_switched(ch))
				act("$t", ch, ch->pcdata->bamfin, rch, TO_VICT);
			else
				act("$n appears in a swirling mist.", ch, nullptr, rch, TO_VICT);
		}
	}

	do_look(ch, "auto");
}